

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O2

void __thiscall
Clasp::DomainHeuristic::applyAction(DomainHeuristic *this,Solver *s,DomAction *a,uint16 *gPrio)

{
  uint16 uVar1;
  int16 iVar2;
  pointer pDVar3;
  uint uVar4;
  ushort uVar5;
  ulong uVar6;
  VarOrder *this_00;
  
  uVar1 = *gPrio;
  *gPrio = a->prio;
  a->prio = uVar1;
  uVar6 = *(ulong *)a;
  uVar4 = (uint)uVar6;
  switch(uVar6 >> 0x1e & 3) {
  case 0:
    pDVar3 = (this->super_ClaspVsids_t<Clasp::DomScore>).score_.ebo_.buf;
    iVar2 = pDVar3[uVar6 & 0x3fffffff].level;
    pDVar3[uVar6 & 0x3fffffff].level = a->bias;
    a->bias = iVar2;
    uVar6 = *(ulong *)a & 0x3fffffff;
    if ((uVar6 < (this->super_ClaspVsids_t<Clasp::DomScore>).vars_.indices_.ebo_.size) &&
       (this_00 = &(this->super_ClaspVsids_t<Clasp::DomScore>).vars_,
       (this_00->indices_).ebo_.buf[uVar6] != 0xffffffffffffffff)) {
      bk_lib::indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore>::update
                (this_00,uVar6);
      return;
    }
    break;
  case 1:
    if ((uVar4 & 0x3fffffff) < (s->assign_).pref_.ebo_.size) {
      uVar5 = (s->assign_).pref_.ebo_.buf[uVar4 & 0x3fffffff].rep & 3;
    }
    else {
      uVar5 = 0;
    }
    Solver::setPref(s,uVar4 & 0x3fffffff,user_value,(ValueRep)a->bias);
    a->bias = uVar5;
    break;
  case 2:
    pDVar3 = (this->super_ClaspVsids_t<Clasp::DomScore>).score_.ebo_.buf;
    iVar2 = pDVar3[uVar4 & 0x3fffffff].factor;
    pDVar3[uVar4 & 0x3fffffff].factor = a->bias;
    a->bias = iVar2;
    break;
  case 3:
    (this->super_ClaspVsids_t<Clasp::DomScore>).score_.ebo_.buf[uVar4 & 0x3fffffff].super_VsidsScore
    .value = (double)(int)a->bias;
  }
  return;
}

Assistant:

void DomainHeuristic::applyAction(Solver& s, DomAction& a, uint16& gPrio) {
	std::swap(gPrio, a.prio);
	switch (a.mod) {
		default: assert(false); break;
		case DomModType::Init:
			score_[a.var].value = a.bias;
			break;
		case DomModType::Factor: std::swap(score_[a.var].factor, a.bias); break;
		case DomModType::Level:
			std::swap(score_[a.var].level, a.bias);
			if (vars_.is_in_queue(a.var)) { vars_.update(a.var); }
			break;
		case DomModType::Sign:
			int16 old = s.pref(a.var).get(ValueSet::user_value);
			s.setPref(a.var, ValueSet::user_value, ValueRep(a.bias));
			a.bias    = old;
			break;
	}
}